

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeZone.cc
# Opt level: O0

tm * __thiscall muduo::TimeZone::toLocalTime(TimeZone *this,time_t seconds)

{
  Transition sentry_00;
  element_type *peVar1;
  Localtime *pLVar2;
  char *pcVar3;
  time_t in_RDX;
  tm *in_RDI;
  time_t localSeconds;
  Localtime *local;
  Transition sentry;
  Data *data;
  size_t in_stack_ffffffffffffff68;
  __shared_ptr_access<muduo::TimeZone::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff70;
  long local_60;
  Data *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffc8;
  time_t in_stack_ffffffffffffffd0;
  time_t tVar4;
  undefined8 local_20;
  
  memZero(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  peVar1 = std::__shared_ptr_access<muduo::TimeZone::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(in_stack_ffffffffffffff70);
  detail::Transition::Transition((Transition *)&stack0xffffffffffffffd0,in_RDX,0,0);
  tVar4 = in_stack_ffffffffffffffd0;
  detail::Comp::Comp((Comp *)&stack0xffffffffffffffaf,true);
  sentry_00.localtime = in_stack_ffffffffffffffc8;
  sentry_00.gmttime = local_20;
  sentry_00._16_8_ = tVar4;
  pLVar2 = detail::findLocaltime
                     (in_stack_ffffffffffffffa8,sentry_00,
                      (Comp)SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x38,0));
  if (pLVar2 != (Localtime *)0x0) {
    local_60 = in_RDX + pLVar2->gmtOffset;
    gmtime_r(&local_60,in_RDI);
    in_RDI->tm_isdst = (uint)(pLVar2->isDst & 1);
    in_RDI->tm_gmtoff = pLVar2->gmtOffset;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&peVar1->abbreviation);
    in_RDI->tm_zone = pcVar3;
  }
  return (tm *)in_RDI;
}

Assistant:

struct tm TimeZone::toLocalTime(time_t seconds) const
{
  struct tm localTime;
  memZero(&localTime, sizeof(localTime));
  assert(data_ != NULL);
  const Data& data(*data_);

  detail::Transition sentry(seconds, 0, 0);
  const detail::Localtime* local = findLocaltime(data, sentry, detail::Comp(true));

  if (local)
  {
    time_t localSeconds = seconds + local->gmtOffset;
    ::gmtime_r(&localSeconds, &localTime); // FIXME: fromUtcTime
    localTime.tm_isdst = local->isDst;
    localTime.tm_gmtoff = local->gmtOffset;
    localTime.tm_zone = &data.abbreviation[local->arrbIdx];
  }

  return localTime;
}